

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

Dim * __thiscall
cnn::Conv1DWide::dim_forward
          (Dim *__return_storage_ptr__,Conv1DWide *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  uint uVar4;
  long lVar5;
  uint local_18 [2];
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 == 0x48) {
    uVar4 = 1;
    if (1 < pDVar2[1].nd) {
      uVar4 = pDVar2[1].d[1];
    }
    if (((pDVar2->nd == 2) && (pDVar2[1].nd == 2)) && (pDVar2->d[0] == pDVar2[1].d[0])) {
      lVar5 = 0;
      local_18[1] = (pDVar2->d[1] - 1) + uVar4;
      local_18[0] = pDVar2->d[0];
      __return_storage_ptr__->nd = 0;
      __return_storage_ptr__->bd = 1;
      do {
        uVar4 = *(uint *)((long)local_18 + lVar5);
        uVar1 = __return_storage_ptr__->nd;
        __return_storage_ptr__->nd = uVar1 + 1;
        __return_storage_ptr__->d[uVar1] = uVar4;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 8);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad input dimensions in Conv1DWide: ",0x24);
    poVar3 = operator<<((ostream *)&std::cerr,xs);
    std::endl<char,std::char_traits<char>>(poVar3);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad input dimensions in Conv1DWide");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Conv1DWide requires two inputs: ",0x20);
    poVar3 = operator<<((ostream *)&std::cerr,xs);
    std::endl<char,std::char_traits<char>>(poVar3);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Conv1DWide requires two inputs");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Conv1DWide::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2) {
    cerr << "Conv1DWide requires two inputs: " << xs << endl;
    throw std::invalid_argument("Conv1DWide requires two inputs");
  }
  unsigned ocols = xs[0].cols() + xs[1].cols() - 1;
  if (xs[0].ndims() != 2 || xs[1].ndims() != 2 ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad input dimensions in Conv1DWide: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in Conv1DWide");
  }
  return Dim({xs[0].rows(), ocols});
}